

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGXMLScanner.cpp
# Opt level: O2

void __thiscall xercesc_4_0::IGXMLScanner::scanDocTypeDecl(IGXMLScanner *this)

{
  ReaderMgr *this_00;
  XMLBufferMgr *this_01;
  DocTypeHandler *pDVar1;
  MemoryManager *manager;
  NameIdPool<xercesc_4_0::DTDElementDecl> *this_02;
  Grammar *pGVar2;
  XMLCh *toRep;
  GrammarResolver *this_03;
  XMLValidator *pXVar3;
  XMLStringPool *pXVar4;
  bool bVar5;
  XMLCh XVar6;
  XMLCh XVar7;
  int iVar8;
  int iVar9;
  DTDElementDecl *this_04;
  DTDElementDecl *pDVar10;
  XMLCh *pXVar11;
  XMLSize_t XVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DTDGrammar *pDVar14;
  XMLReader *reader;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  DTDEntityDecl *this_05;
  RuntimeException *this_06;
  undefined4 extraout_var_03;
  MemoryManager **ppMVar15;
  uint uVar16;
  byte bVar17;
  InputSource *pIVar18;
  XMLCh *local_108;
  bool skippedSomething;
  InputSource *srcUsed;
  DTDElementDecl *local_f0;
  ArrayJanitor<char16_t> janSysId;
  ArrayJanitor<char16_t> janPubId;
  XMLBufBid bbRootName;
  XMLCh gDTDStr [4];
  int colonPosition;
  DTDScanner dtdScanner;
  InputSource *pIVar13;
  
  switchGrammar(this,(XMLCh *)XMLUni::fgDTDEntityString);
  pDVar1 = (this->super_XMLScanner).fDocTypeHandler;
  if (pDVar1 != (DocTypeHandler *)0x0) {
    (*pDVar1->_vptr_DocTypeHandler[0xc])();
  }
  this_00 = &(this->super_XMLScanner).fReaderMgr;
  ReaderMgr::skipPastSpaces(this_00,&skippedSomething,false);
  if (skippedSomething == false) {
    XMLScanner::emitError(&this->super_XMLScanner,ExpectedWhitespace);
    ReaderMgr::skipPastChar(this_00,L'>');
    return;
  }
  this_01 = &(this->super_XMLScanner).fBufMgr;
  bbRootName.fBuffer = XMLBufferMgr::bidOnBuffer(this_01);
  bbRootName.fMgr = this_01;
  if ((this->super_XMLScanner).fDoNamespaces == true) {
    bVar5 = ReaderMgr::getQName(this_00,bbRootName.fBuffer,&colonPosition);
  }
  else {
    bVar5 = ReaderMgr::getName(this_00,bbRootName.fBuffer);
  }
  if (bVar5 == false) {
    if ((bbRootName.fBuffer)->fIndex == 0) {
      XMLScanner::emitError(&this->super_XMLScanner,NoRootElemInDOCTYPE);
    }
    else {
      pXVar11 = (bbRootName.fBuffer)->fBuffer;
      pXVar11[(bbRootName.fBuffer)->fIndex] = L'\0';
      XMLScanner::emitError
                (&this->super_XMLScanner,InvalidRootElemInDOCTYPE,pXVar11,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0);
    }
    ReaderMgr::skipPastChar(this_00,L'>');
    goto LAB_002a8feb;
  }
  pXVar11 = (bbRootName.fBuffer)->fBuffer;
  pXVar11[(bbRootName.fBuffer)->fIndex] = L'\0';
  XMLScanner::setRootElemName(&this->super_XMLScanner,pXVar11);
  ppMVar15 = &(this->super_XMLScanner).fGrammarPoolMemoryManager;
  if ((this->super_XMLScanner).fUseCachedGrammar != false) {
    ppMVar15 = &(this->super_XMLScanner).fMemoryManager;
  }
  manager = *ppMVar15;
  this_04 = (DTDElementDecl *)XMemory::operator_new(0x58,manager);
  pXVar11 = (bbRootName.fBuffer)->fBuffer;
  pXVar11[(bbRootName.fBuffer)->fIndex] = L'\0';
  DTDElementDecl::DTDElementDecl
            (this_04,pXVar11,(this->super_XMLScanner).fEmptyNamespaceId,Any,manager);
  (this_04->super_XMLElementDecl).fCreateReason = AsRootElem;
  (this_04->super_XMLElementDecl).fExternalElement = true;
  local_f0 = this_04;
  if ((this->super_XMLScanner).fUseCachedGrammar == false) {
    pGVar2 = (this->super_XMLScanner).fGrammar;
    (*(pGVar2->super_XSerializable)._vptr_XSerializable[0x11])(pGVar2,this_04,0);
    local_f0 = (DTDElementDecl *)0x0;
  }
  else {
    this_02 = this->fDTDElemNonDeclPool;
    pXVar11 = (bbRootName.fBuffer)->fBuffer;
    pXVar11[(bbRootName.fBuffer)->fIndex] = L'\0';
    pDVar10 = NameIdPool<xercesc_4_0::DTDElementDecl>::getByKey(this_02,pXVar11);
    if (pDVar10 == (DTDElementDecl *)0x0) {
      XVar12 = NameIdPool<xercesc_4_0::DTDElementDecl>::put(this->fDTDElemNonDeclPool,this_04);
      local_f0 = (DTDElementDecl *)0x0;
    }
    else {
      XVar12 = (pDVar10->super_XMLElementDecl).fId;
    }
    (this_04->super_XMLElementDecl).fId = XVar12;
  }
  ReaderMgr::skipPastSpaces(this_00);
  bVar5 = ReaderMgr::skippedChar(this_00,L'>');
  if (bVar5) {
    pDVar1 = (this->super_XMLScanner).fDocTypeHandler;
    if (pDVar1 != (DocTypeHandler *)0x0) {
      (*pDVar1->_vptr_DocTypeHandler[4])(pDVar1,this_04,0,0,0,0);
    }
  }
  else {
    if (((this->super_XMLScanner).fValScheme == Val_Auto) &&
       ((this->super_XMLScanner).fValidate == false)) {
      (this->super_XMLScanner).fValidate = true;
    }
    DTDScanner::DTDScanner
              (&dtdScanner,(DTDGrammar *)(this->super_XMLScanner).fGrammar,
               (this->super_XMLScanner).fDocTypeHandler,
               (this->super_XMLScanner).fGrammarPoolMemoryManager,
               (this->super_XMLScanner).fMemoryManager);
    DTDScanner::setScannerInfo(&dtdScanner,&this->super_XMLScanner,this_00,this_01);
    XVar6 = ReaderMgr::peekNextChar(this_00);
    if (XVar6 == L'[') {
      uVar16 = 1;
      local_108 = (char16_t *)0x0;
      pXVar11 = (char16_t *)0x0;
LAB_002a8c1d:
      ArrayJanitor<char16_t>::ArrayJanitor
                (&janSysId,local_108,(this->super_XMLScanner).fMemoryManager);
      ArrayJanitor<char16_t>::ArrayJanitor
                (&janPubId,pXVar11,(this->super_XMLScanner).fMemoryManager);
      if (XVar6 != L'[') {
        ReaderMgr::skipPastSpaces(this_00);
        XVar7 = ReaderMgr::peekNextChar(this_00);
        if (XVar7 == L'[') {
          uVar16 = 1;
        }
      }
      pDVar1 = (this->super_XMLScanner).fDocTypeHandler;
      if (pDVar1 != (DocTypeHandler *)0x0) {
        (*pDVar1->_vptr_DocTypeHandler[4])
                  (pDVar1,this_04,pXVar11,local_108,(ulong)uVar16,(ulong)(XVar6 != L'['));
      }
      bVar17 = 1;
      if ((char)uVar16 == '\0') {
LAB_002a8d02:
        bVar5 = ReaderMgr::skippedChar(this_00,L'>');
        if (!bVar5) {
          bVar5 = ReaderMgr::skippedChar(this_00,L']');
          if ((bVar5) && (bVar5 = ReaderMgr::skippedChar(this_00,L'>'), bVar5)) {
            XMLScanner::emitError(&this->super_XMLScanner,ExtraCloseSquare);
          }
          else {
            XMLScanner::emitError(&this->super_XMLScanner,UnterminatedDOCTYPE);
            ReaderMgr::skipPastChar(this_00,L'>');
          }
        }
        if (XVar6 != L'[') {
          srcUsed = (InputSource *)0x0;
          if ((bVar17 & (this->super_XMLScanner).fUseCachedGrammar) == 1) {
            iVar8 = (*(this->super_XMLScanner).super_XMLBufferFullHandler._vptr_XMLBufferFullHandler
                      [0x11])(this,local_108,pXVar11);
            pIVar13 = (InputSource *)CONCAT44(extraout_var,iVar8);
            srcUsed = pIVar13;
            if (pIVar13 == (InputSource *)0x0) goto LAB_002a8e0f;
            this_03 = (this->super_XMLScanner).fGrammarResolver;
            iVar8 = (*pIVar13->_vptr_InputSource[5])(pIVar13);
            pDVar14 = (DTDGrammar *)
                      GrammarResolver::getGrammar(this_03,(XMLCh *)CONCAT44(extraout_var_00,iVar8));
            pIVar18 = pIVar13;
            if ((pDVar14 == (DTDGrammar *)0x0) ||
               (iVar8 = (*(pDVar14->super_Grammar).super_XSerializable._vptr_XSerializable[5])
                                  (pDVar14), iVar8 != 0)) goto LAB_002a8e12;
            this->fDTDGrammar = pDVar14;
            (this->super_XMLScanner).fGrammar = (Grammar *)pDVar14;
            pXVar3 = (this->super_XMLScanner).fValidator;
            (*pXVar3->_vptr_XMLValidator[0xb])(pXVar3,pDVar14);
            pDVar1 = (this->super_XMLScanner).fDocTypeHandler;
            if (pDVar1 != (DocTypeHandler *)0x0) {
              (*pDVar1->_vptr_DocTypeHandler[0x10])();
              (*((this->super_XMLScanner).fDocTypeHandler)->_vptr_DocTypeHandler[10])();
            }
          }
          else {
LAB_002a8e0f:
            pIVar18 = (InputSource *)0x0;
LAB_002a8e12:
            pIVar13 = pIVar18;
            if (((this->super_XMLScanner).fLoadExternalDTD != false) ||
               ((this->super_XMLScanner).fValidate == true)) {
              XVar12 = (this->super_XMLScanner).fLowWaterMark;
              bVar5 = (this->super_XMLScanner).fCalculateSrcOfs;
              if (srcUsed == (InputSource *)0x0) {
                reader = ReaderMgr::createReader
                                   (this_00,local_108,pXVar11,false,RefFrom_NonLiteral,Type_General,
                                    Source_External,&srcUsed,bVar5,XVar12,
                                    (this->super_XMLScanner).fDisableDefaultEntityResolution);
                pIVar13 = srcUsed;
                if (pIVar18 != (InputSource *)0x0) {
                  (*pIVar18->_vptr_InputSource[1])(pIVar18);
                }
              }
              else {
                reader = ReaderMgr::createReader
                                   (this_00,srcUsed,false,RefFrom_NonLiteral,Type_General,
                                    Source_External,bVar5,XVar12);
              }
              if (reader == (XMLReader *)0x0) {
                this_06 = (RuntimeException *)__cxa_allocate_exception(0x30);
                if (srcUsed != (InputSource *)0x0) {
                  iVar8 = (*srcUsed->_vptr_InputSource[5])();
                  local_108 = (XMLCh *)CONCAT44(extraout_var_03,iVar8);
                }
                RuntimeException::RuntimeException
                          (this_06,
                           "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/IGXMLScanner.cpp"
                           ,0x5ed,Gen_CouldNotOpenDTD,local_108,(XMLCh *)0x0,(XMLCh *)0x0,
                           (XMLCh *)0x0,(this->super_XMLScanner).fMemoryManager);
                __cxa_throw(this_06,&RuntimeException::typeinfo,XMLException::~XMLException);
              }
              if ((this->super_XMLScanner).fToCacheGrammar == true) {
                pXVar4 = ((this->super_XMLScanner).fGrammarResolver)->fStringPool;
                iVar8 = (*srcUsed->_vptr_InputSource[5])();
                uVar16 = (*(pXVar4->super_XSerializable)._vptr_XSerializable[5])
                                   (pXVar4,CONCAT44(extraout_var_01,iVar8));
                pXVar4 = ((this->super_XMLScanner).fGrammarResolver)->fStringPool;
                iVar8 = (*(pXVar4->super_XSerializable)._vptr_XSerializable[10])
                                  (pXVar4,(ulong)uVar16);
                GrammarResolver::orphanGrammar
                          ((this->super_XMLScanner).fGrammarResolver,
                           (XMLCh *)XMLUni::fgDTDEntityString);
                iVar9 = (*(((this->super_XMLScanner).fGrammar)->super_XSerializable).
                          _vptr_XSerializable[0x16])();
                (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar9) + 0x50))
                          ((long *)CONCAT44(extraout_var_02,iVar9),iVar8);
                GrammarResolver::putGrammar
                          ((this->super_XMLScanner).fGrammarResolver,
                           (this->super_XMLScanner).fGrammar);
              }
              builtin_memcpy(gDTDStr,L"DTD",8);
              this_05 = (DTDEntityDecl *)
                        XMemory::operator_new(0x60,(this->super_XMLScanner).fMemoryManager);
              DTDEntityDecl::DTDEntityDecl
                        (this_05,gDTDStr,false,(this->super_XMLScanner).fMemoryManager);
              XMLEntityDecl::setSystemId((XMLEntityDecl *)this_05,local_108);
              (this_05->super_XMLEntityDecl).fIsExternal = true;
              reader->fThrowAtEnd = true;
              ReaderMgr::pushReaderAdoptEntity(this_00,reader,(XMLEntityDecl *)this_05,true);
              DTDScanner::scanExtSubsetDecl(&dtdScanner,false,true);
            }
            if (pIVar13 == (InputSource *)0x0) goto LAB_002a8fbd;
          }
          (*pIVar13->_vptr_InputSource[1])(pIVar13);
        }
      }
      else {
        ReaderMgr::getNextChar(this_00);
        XMLScanner::checkInternalDTD(&this->super_XMLScanner,XVar6 != L'[',local_108,pXVar11);
        bVar5 = DTDScanner::scanInternalSubset(&dtdScanner);
        if (bVar5) {
          XVar12 = ReaderMgr::getReaderDepth(this_00);
          if (1 < XVar12) {
            XMLScanner::emitError(&this->super_XMLScanner,PEPropogated);
            ReaderMgr::cleanStackBackTo(this_00,1);
          }
          ReaderMgr::skipPastSpaces(this_00);
          bVar17 = 0;
          goto LAB_002a8d02;
        }
        ReaderMgr::skipPastChar(this_00,L'>');
      }
LAB_002a8fbd:
      ArrayJanitor<char16_t>::~ArrayJanitor(&janPubId);
      ArrayJanitor<char16_t>::~ArrayJanitor(&janSysId);
    }
    else {
      (this->super_XMLScanner).fHasNoDTD = false;
      janSysId.fData = (char16_t *)XMLBufferMgr::bidOnBuffer(this_01);
      janSysId.fMemoryManager = (MemoryManager *)this_01;
      janPubId.fData = (char16_t *)XMLBufferMgr::bidOnBuffer(this_01);
      janPubId.fMemoryManager = (MemoryManager *)this_01;
      bVar5 = DTDScanner::scanId(&dtdScanner,(XMLBuffer *)janSysId.fData,(XMLBuffer *)janPubId.fData
                                 ,IDType_External);
      if (bVar5) {
        pXVar11 = *(XMLCh **)(janSysId.fData + 0x18);
        pXVar11[*(long *)janSysId.fData] = L'\0';
        pXVar11 = XMLString::replicate(pXVar11,(this->super_XMLScanner).fMemoryManager);
        toRep = *(XMLCh **)(janPubId.fData + 0x18);
        toRep[*(long *)janPubId.fData] = L'\0';
        local_108 = XMLString::replicate(toRep,(this->super_XMLScanner).fMemoryManager);
      }
      else {
        ReaderMgr::skipPastChar(this_00,L'>');
        local_108 = (XMLCh *)0x0;
        pXVar11 = (XMLCh *)0x0;
      }
      XMLBufBid::~XMLBufBid((XMLBufBid *)&janPubId);
      XMLBufBid::~XMLBufBid((XMLBufBid *)&janSysId);
      if (bVar5) {
        uVar16 = 0;
        goto LAB_002a8c1d;
      }
    }
    DTDScanner::~DTDScanner(&dtdScanner);
  }
  if (local_f0 != (DTDElementDecl *)0x0) {
    (*(local_f0->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[1])();
  }
LAB_002a8feb:
  XMLBufBid::~XMLBufBid(&bbRootName);
  return;
}

Assistant:

void IGXMLScanner::scanDocTypeDecl()
{
    //  We have a doc type. So, switch the Grammar.
    switchGrammar(XMLUni::fgDTDEntityString);

    if (fDocTypeHandler)
        fDocTypeHandler->resetDocType();

    // There must be some space after DOCTYPE
    bool skippedSomething;
    fReaderMgr.skipPastSpaces(skippedSomething);
    if (!skippedSomething)
    {
        emitError(XMLErrs::ExpectedWhitespace);

        // Just skip the Doctype declaration and return
        fReaderMgr.skipPastChar(chCloseAngle);
        return;
    }

    // Get a buffer for the root element
    XMLBufBid bbRootName(&fBufMgr);

    //  Get a name from the input, which should be the name of the root
    //  element of the upcoming content.
    int  colonPosition;
    bool validName = fDoNamespaces ? fReaderMgr.getQName(bbRootName.getBuffer(), &colonPosition) :
                                     fReaderMgr.getName(bbRootName.getBuffer());
    if (!validName)
    {
        if (bbRootName.isEmpty())
            emitError(XMLErrs::NoRootElemInDOCTYPE);
        else
            emitError(XMLErrs::InvalidRootElemInDOCTYPE, bbRootName.getRawBuffer());
        fReaderMgr.skipPastChar(chCloseAngle);
        return;
    }

    //  Store the root element name for later check
    setRootElemName(bbRootName.getRawBuffer());

    //  This element obviously is not going to exist in the element decl
    //  pool yet, but we need to call docTypeDecl. So force it into
    //  the element decl pool, marked as being there because it was in
    //  the DOCTYPE. Later, when its declared, the status will be updated.
    //
    //  Only do this if we are not reusing the validator! If we are reusing,
    //  then look it up instead. It has to exist!
    MemoryManager* const  rootDeclMgr =
        fUseCachedGrammar ? fMemoryManager : fGrammarPoolMemoryManager;

    DTDElementDecl* rootDecl = new (rootDeclMgr) DTDElementDecl
    (
        bbRootName.getRawBuffer()
        , fEmptyNamespaceId
        , DTDElementDecl::Any
        , rootDeclMgr
    );

    Janitor<DTDElementDecl> rootDeclJanitor(rootDecl);
    rootDecl->setCreateReason(DTDElementDecl::AsRootElem);
    rootDecl->setExternalElemDeclaration(true);
    if(!fUseCachedGrammar)
    {
        fGrammar->putElemDecl(rootDecl);
        rootDeclJanitor.release();
    } else
    {
        // attach this to the undeclared element pool so that it gets deleted
        XMLElementDecl* elemDecl = fDTDElemNonDeclPool->getByKey(bbRootName.getRawBuffer());
        if (elemDecl)
        {
            rootDecl->setId(elemDecl->getId());
        }
        else
        {
            rootDecl->setId(fDTDElemNonDeclPool->put((DTDElementDecl*)rootDecl));
            rootDeclJanitor.release();
        }
    }

    // Skip any spaces after the name
    fReaderMgr.skipPastSpaces();

    //  And now if we are looking at a >, then we are done. It is not
    //  required to have an internal or external subset, though why you
    //  would not escapes me.
    if (fReaderMgr.skippedChar(chCloseAngle)) {

        //  If we have a doc type handler and advanced callbacks are enabled,
        //  call the doctype event.
        if (fDocTypeHandler)
            fDocTypeHandler->doctypeDecl(*rootDecl, 0, 0, false);
        return;
    }

    // either internal/external subset
    if (fValScheme == Val_Auto && !fValidate)
        fValidate = true;

    bool    hasIntSubset = false;
    bool    hasExtSubset = false;
    XMLCh*  sysId = 0;
    XMLCh*  pubId = 0;

    DTDScanner dtdScanner
    (
        (DTDGrammar*) fGrammar
        , fDocTypeHandler
        , fGrammarPoolMemoryManager
        , fMemoryManager
    );
    dtdScanner.setScannerInfo(this, &fReaderMgr, &fBufMgr);

    //  If the next character is '[' then we have no external subset cause
    //  there is no system id, just the opening character of the internal
    //  subset. Else, has to be an id.
    //
    // Just look at the next char, don't eat it.
    if (fReaderMgr.peekNextChar() == chOpenSquare)
    {
        hasIntSubset = true;
    }
    else
    {
        // Indicate we have an external subset
        hasExtSubset = true;
        fHasNoDTD = false;

        // Get buffers for the ids
        XMLBufBid bbPubId(&fBufMgr);
        XMLBufBid bbSysId(&fBufMgr);

        // Get the external subset id
        if (!dtdScanner.scanId(bbPubId.getBuffer(), bbSysId.getBuffer(), DTDScanner::IDType_External))
        {
            fReaderMgr.skipPastChar(chCloseAngle);
            return;
        }

        // Get copies of the ids we got
        pubId = XMLString::replicate(bbPubId.getRawBuffer(), fMemoryManager);
        sysId = XMLString::replicate(bbSysId.getRawBuffer(), fMemoryManager);
    }

    // Insure that the ids get cleaned up, if they got allocated
    ArrayJanitor<XMLCh> janSysId(sysId, fMemoryManager);
    ArrayJanitor<XMLCh> janPubId(pubId, fMemoryManager);

    if (hasExtSubset)
    {
        // Skip spaces and check again for the opening of an internal subset
        fReaderMgr.skipPastSpaces();

        // Just look at the next char, don't eat it.
        if (fReaderMgr.peekNextChar() == chOpenSquare) {
            hasIntSubset = true;
        }
    }

    //  If we have a doc type handler and advanced callbacks are enabled,
    //  call the doctype event.
    if (fDocTypeHandler)
        fDocTypeHandler->doctypeDecl(*rootDecl, pubId, sysId, hasIntSubset, hasExtSubset);

    //  Ok, if we had an internal subset, we are just past the [ character
    //  and need to parse that first.
    if (hasIntSubset)
    {
        // Eat the opening square bracket
        fReaderMgr.getNextChar();

        checkInternalDTD(hasExtSubset, sysId, pubId);

        //  And try to scan the internal subset. If we fail, try to recover
        //  by skipping forward tot he close angle and returning.
        if (!dtdScanner.scanInternalSubset())
        {
            fReaderMgr.skipPastChar(chCloseAngle);
            return;
        }

        //  Do a sanity check that some expanded PE did not propogate out of
        //  the doctype. This could happen if it was terminated early by bad
        //  syntax.
        if (fReaderMgr.getReaderDepth() > 1)
        {
            emitError(XMLErrs::PEPropogated);

            // Ask the reader manager to pop back down to the main level
            fReaderMgr.cleanStackBackTo(1);
        }

        fReaderMgr.skipPastSpaces();
    }

    // And that should leave us at the closing > of the DOCTYPE line
    if (!fReaderMgr.skippedChar(chCloseAngle))
    {
        //  Do a special check for the common scenario of an extra ] char at
        //  the end. This is easy to recover from.
        if (fReaderMgr.skippedChar(chCloseSquare)
        &&  fReaderMgr.skippedChar(chCloseAngle))
        {
            emitError(XMLErrs::ExtraCloseSquare);
        }
         else
        {
            emitError(XMLErrs::UnterminatedDOCTYPE);
            fReaderMgr.skipPastChar(chCloseAngle);
        }
    }

    //  If we had an external subset, then we need to deal with that one
    //  next. If we are reusing the validator, then don't scan it.
    if (hasExtSubset) {

        InputSource* srcUsed=0;
        Janitor<InputSource> janSrc(srcUsed);
        // If we had an internal subset and we're using the cached grammar, it
        // means that the ignoreCachedDTD is set, so we ignore the cached
        // grammar
        if (fUseCachedGrammar && !hasIntSubset)
        {
            srcUsed = resolveSystemId(sysId, pubId);
            if (srcUsed) {
                janSrc.reset(srcUsed);
                Grammar* grammar = fGrammarResolver->getGrammar(srcUsed->getSystemId());

                if (grammar && grammar->getGrammarType() == Grammar::DTDGrammarType) {

                    fDTDGrammar = (DTDGrammar*) grammar;
                    fGrammar = fDTDGrammar;
                    fValidator->setGrammar(fGrammar);
                    // If we don't report at least the external subset boundaries,
                    // an advanced document handler cannot know when the DTD end,
                    // since we've already sent a doctype decl that indicates there's
                    // there's an external subset.
                    if (fDocTypeHandler)
                    {
                        fDocTypeHandler->startExtSubset();
                        fDocTypeHandler->endExtSubset();
                    }

                    return;
                }
            }
        }

        if (fLoadExternalDTD || fValidate)
        {
            // And now create a reader to read this entity
            XMLReader* reader;
            if (srcUsed) {
                reader = fReaderMgr.createReader
                        (
                            *srcUsed
                            , false
                            , XMLReader::RefFrom_NonLiteral
                            , XMLReader::Type_General
                            , XMLReader::Source_External
                            , fCalculateSrcOfs
                            , fLowWaterMark
                        );
            }
            else {
                reader = fReaderMgr.createReader
                        (
                            sysId
                            , pubId
                            , false
                            , XMLReader::RefFrom_NonLiteral
                            , XMLReader::Type_General
                            , XMLReader::Source_External
                            , srcUsed
                            , fCalculateSrcOfs
                            , fLowWaterMark
                            , fDisableDefaultEntityResolution
                        );
                janSrc.reset(srcUsed);
            }
            //  If it failed then throw an exception
            if (!reader)
                ThrowXMLwithMemMgr1(RuntimeException, XMLExcepts::Gen_CouldNotOpenDTD, srcUsed ? srcUsed->getSystemId() : sysId, fMemoryManager);

            if (fToCacheGrammar) {

                unsigned int stringId = fGrammarResolver->getStringPool()->addOrFind(srcUsed->getSystemId());
                const XMLCh* sysIdStr = fGrammarResolver->getStringPool()->getValueForId(stringId);

                fGrammarResolver->orphanGrammar(XMLUni::fgDTDEntityString);
                ((XMLDTDDescription*) (fGrammar->getGrammarDescription()))->setSystemId(sysIdStr);
                fGrammarResolver->putGrammar(fGrammar);
            }

            //  In order to make the processing work consistently, we have to
            //  make this look like an external entity. So create an entity
            //  decl and fill it in and push it with the reader, as happens
            //  with an external entity. Put a janitor on it to insure it gets
            //  cleaned up. The reader manager does not adopt them.
            const XMLCh gDTDStr[] = { chLatin_D, chLatin_T, chLatin_D , chNull };
            DTDEntityDecl* declDTD = new (fMemoryManager) DTDEntityDecl(gDTDStr, false, fMemoryManager);
            declDTD->setSystemId(sysId);
            declDTD->setIsExternal(true);

            // Mark this one as a throw at end
            reader->setThrowAtEnd(true);

            // And push it onto the stack, with its pseudo name
            fReaderMgr.pushReaderAdoptEntity(reader, declDTD);

            // Tell it its not in an include section
            dtdScanner.scanExtSubsetDecl(false, true);
        }
    }
}